

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr-parser.c
# Opt level: O1

int coda_expression_parse(void *scanner)

{
  ulong uVar1;
  short sVar2;
  uint uVar3;
  short *psVar4;
  YYSTYPE string_value;
  YYSTYPE op2;
  yytype_int8 *scanner_00;
  uint uVar5;
  YYSTYPE *pYVar6;
  YYSTYPE *extraout_RDX;
  YYSTYPE *extraout_RDX_00;
  YYSTYPE *extraout_RDX_01;
  YYSTYPE op1;
  YYSTYPE *extraout_RDX_02;
  yytype_int16 *yyvaluep;
  YYSTYPE *extraout_RDX_03;
  YYSTYPE *extraout_RDX_04;
  YYSTYPE *extraout_RDX_05;
  YYSTYPE *extraout_RDX_06;
  short *psVar7;
  int iVar8;
  coda_expression_node_type tag;
  char *pcVar9;
  coda_expression_struct *op3;
  coda_expression_struct *op4;
  char cVar10;
  uint uVar11;
  yysymbol_kind_t yVar12;
  long lVar13;
  long lVar14;
  YYSTYPE *pYVar15;
  short *__src;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  char *yymsg;
  YYSTYPE yylval;
  long yymsg_alloc;
  yypcontext_t yyctx;
  char yymsgbuf [128];
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  uint local_8e4;
  short *local_8e0;
  uint local_8d4;
  char *local_8d0;
  YYSTYPE local_8c8;
  YYSTYPE *local_8c0;
  size_t local_8b8;
  short *local_8b0;
  YYSTYPE *local_8a8;
  void *local_8a0;
  yypcontext_t local_898;
  char local_888 [128];
  short local_808 [200];
  YYSTYPE local_678 [201];
  
  local_8c8.stringval = (char *)0x0;
  local_8d0 = local_888;
  local_8b8 = 0x80;
  local_8e4 = 0xfffffffe;
  pYVar15 = local_678;
  psVar7 = local_808;
  local_8d4 = 0;
  uVar3 = 0;
  yyvaluep = (yytype_int16 *)(YYSTYPE *)0xc8;
  __src = psVar7;
  local_8c0 = pYVar15;
  local_8a0 = scanner;
LAB_001395d1:
  *psVar7 = (short)uVar3;
  scanner_00 = (yytype_int8 *)(__src + (long)yyvaluep + -1);
  if (scanner_00 <= psVar7) {
    cVar10 = '\x04';
    local_8e0 = __src;
    if ((long)yyvaluep < 10000) {
      lVar13 = (long)psVar7 - (long)__src >> 1;
      lVar14 = lVar13 + 1;
      pYVar6 = (YYSTYPE *)((long)yyvaluep * 2);
      if (9999 < (long)pYVar6) {
        pYVar6 = (YYSTYPE *)0x2710;
      }
      psVar4 = (short *)malloc((long)pYVar6 * 10 + 7);
      local_8a8 = pYVar6;
      if (psVar4 == (short *)0x0) {
        cVar10 = '\x04';
        pYVar6 = local_8c0;
      }
      else {
        local_8b0 = psVar4;
        memcpy(psVar4,__src,lVar14 * 2);
        uVar1 = (long)pYVar6 * 2 + 7;
        uVar16 = (long)pYVar6 * 2 + 0xe;
        if (-1 < (long)uVar1) {
          uVar16 = uVar1;
        }
        pYVar6 = (YYSTYPE *)((uVar16 & 0xfffffffffffffff8) + (long)local_8b0);
        memcpy(pYVar6,local_8c0,lVar14 * 8);
        cVar10 = '\0';
        local_8e0 = local_8b0;
        psVar4 = local_8b0;
        if (__src != local_808) {
          free(__src);
          local_8e0 = local_8b0;
          psVar4 = local_8b0;
        }
      }
      local_8c0 = pYVar6;
      scanner_00 = (yytype_int8 *)local_8e0;
      yyvaluep = (yytype_int16 *)local_8a8;
      if (psVar4 != (short *)0x0) {
        psVar7 = local_8e0 + lVar13;
        pYVar15 = local_8c0 + lVar13;
        cVar10 = ((long)local_8a8 <= lVar14) * '\t';
        scanner_00 = (yytype_int8 *)(ulong)((long)local_8a8 <= lVar14);
      }
    }
    __src = local_8e0;
    if (cVar10 == '\0') goto LAB_0013970b;
    if (cVar10 == '\x04') {
LAB_0013a5b3:
      coda_set_error(-0x191,"%s","memory exhausted");
      iVar8 = 2;
      yyvaluep = (yytype_int16 *)extraout_RDX_06;
    }
    else {
      iVar8 = 1;
      if (cVar10 != '\t') {
        return 1;
      }
    }
    goto LAB_0013a4f7;
  }
LAB_0013970b:
  local_8e0 = __src;
  if (uVar3 == 0xd8) {
    iVar8 = 0;
    goto LAB_0013a4f7;
  }
  sVar2 = yypact[(int)uVar3];
  local_8a8 = (YYSTYPE *)yyvaluep;
  if (sVar2 != -0x55) {
    if (local_8e4 == 0xfffffffe) {
      local_8e4 = coda_expression_lex(&local_8c8,local_8a0);
      yyvaluep = (yytype_int16 *)extraout_RDX;
    }
    if ((int)local_8e4 < 1) {
      iVar8 = 0;
      local_8e4 = 0;
    }
    else {
      if (local_8e4 == 0x100) {
        local_8e4 = 0x101;
        goto LAB_0013a43b;
      }
      iVar8 = 2;
      if ((int)local_8e4 < 0x14a) {
        iVar8 = (int)""[local_8e4];
      }
    }
    uVar11 = sVar2 + iVar8;
    if ((0xb5b < uVar11) || (iVar8 != yycheck[uVar11])) goto LAB_001397ed;
    uVar5 = (uint)yytable[uVar11];
    if ((int)uVar5 < 1) {
      if (yytable[uVar11] != -1) {
        uVar5 = -uVar5;
        goto LAB_001397fd;
      }
      goto LAB_00139858;
    }
    bVar17 = local_8d4 == 0;
    local_8d4 = local_8d4 - 1;
    if (bVar17) {
      local_8d4 = 0;
    }
    pYVar15[1] = local_8c8;
    pYVar15 = pYVar15 + 1;
    local_8e4 = 0xfffffffe;
    uVar3 = uVar5;
    goto LAB_0013a4a1;
  }
LAB_001397ed:
  uVar5 = (uint)yydefact[(int)uVar3];
  if (uVar5 == 0) goto LAB_00139858;
LAB_001397fd:
  lVar13 = (long)""[(int)uVar5];
  pcVar9 = *(char **)(pYVar15 + (1 - lVar13));
  switch(uVar5) {
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    *(YYSTYPE *)(in_FS_OFFSET + -0x20) = *pYVar15;
    break;
  case 8:
    pcVar9 = "r";
    break;
  case 9:
    pcVar9 = "asciiline";
    break;
  case 10:
    pcVar9 = "do";
    break;
  case 0xb:
    pcVar9 = "for";
    break;
  case 0xc:
    pcVar9 = "step";
    break;
  case 0xd:
    pcVar9 = "to";
    break;
  case 0xe:
    pcVar9 = "nan";
    break;
  case 0xf:
    pcVar9 = "inf";
    break;
  case 0x10:
    pcVar9 = "true";
    break;
  case 0x11:
    pcVar9 = "false";
    break;
  case 0x12:
    pcVar9 = "abs";
    break;
  case 0x13:
    pcVar9 = "add";
    break;
  case 0x14:
    pcVar9 = "all";
    break;
  case 0x15:
    pcVar9 = "at";
    break;
  case 0x16:
    pcVar9 = "bitoffset";
    break;
  case 0x17:
    pcVar9 = "bool";
    break;
  case 0x18:
    pcVar9 = "bytes";
    break;
  case 0x19:
    pcVar9 = "byteoffset";
    break;
  case 0x1a:
    pcVar9 = "bytesize";
    break;
  case 0x1b:
    pcVar9 = "ceil";
    break;
  case 0x1c:
    pcVar9 = "count";
    break;
  case 0x1d:
    pcVar9 = "dim";
    break;
  case 0x1e:
    pcVar9 = "exists";
    break;
  case 0x1f:
    pcVar9 = "filename";
    break;
  case 0x20:
    pcVar9 = "filesize";
    break;
  case 0x21:
    pcVar9 = "float";
    break;
  case 0x22:
    pcVar9 = "floor";
    break;
  case 0x23:
    pcVar9 = "goto";
    break;
  case 0x24:
    pcVar9 = "if";
    break;
  case 0x25:
    pcVar9 = "index";
    break;
  case 0x26:
    pcVar9 = "int";
    break;
  case 0x27:
    pcVar9 = "isnan";
    break;
  case 0x28:
    pcVar9 = "isinf";
    break;
  case 0x29:
    pcVar9 = "isplusinf";
    break;
  case 0x2a:
    pcVar9 = "ismininf";
    break;
  case 0x2b:
    pcVar9 = "length";
    break;
  case 0x2c:
    pcVar9 = "ltrim";
    break;
  case 0x2d:
    pcVar9 = "numdims";
    break;
  case 0x2e:
    pcVar9 = "numelements";
    break;
  case 0x2f:
    pcVar9 = "max";
    break;
  case 0x30:
    pcVar9 = "min";
    break;
  case 0x31:
    pcVar9 = "productclass";
    break;
  case 0x32:
    pcVar9 = "productformat";
    break;
  case 0x33:
    pcVar9 = "producttype";
    break;
  case 0x34:
    pcVar9 = "productversion";
    break;
  case 0x35:
    pcVar9 = "regex";
    break;
  case 0x36:
    pcVar9 = "round";
    break;
  case 0x37:
    pcVar9 = "rtrim";
    break;
  case 0x38:
    pcVar9 = "str";
    break;
  case 0x39:
    pcVar9 = "strtime";
    break;
  case 0x3a:
    pcVar9 = "substr";
    break;
  case 0x3b:
    pcVar9 = "time";
    break;
  case 0x3c:
    pcVar9 = "trim";
    break;
  case 0x3d:
    pcVar9 = "unboundindex";
    break;
  case 0x3e:
    pcVar9 = "with";
    break;
  case 0x41:
    pcVar9 = strdup(pYVar15->stringval);
    break;
  case 0x42:
    string_value = (YYSTYPE)pYVar15[-2].stringval;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_variable_set;
    goto LAB_0013a299;
  case 0x43:
    string_value = (YYSTYPE)pYVar15[-5].stringval;
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_variable_set;
    goto LAB_0013a385;
  case 0x44:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_sequence;
    goto LAB_0013a383;
  case 0x45:
    string_value = (YYSTYPE)pYVar15[-6].stringval;
    op1 = (YYSTYPE)pYVar15[-4].expr;
    op2 = (YYSTYPE)pYVar15[-2].expr;
    op4 = pYVar15->expr;
    tag = expr_for;
    op3 = (coda_expression *)0x0;
    goto LAB_0013a38b;
  case 0x46:
    string_value = (YYSTYPE)pYVar15[-8].stringval;
    op1 = (YYSTYPE)pYVar15[-6].expr;
    op2 = (YYSTYPE)pYVar15[-4].expr;
    op3 = pYVar15[-2].expr;
    op4 = pYVar15->expr;
    tag = expr_for;
    goto LAB_0013a38b;
  case 0x47:
    op1 = pYVar15[-1];
    tag = expr_goto;
    goto LAB_0013a2a9;
  case 0x48:
  case 0xd4:
  case 0xf4:
    string_value = (YYSTYPE)pYVar15[-5].stringval;
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_with;
    goto LAB_0013a385;
  case 0x49:
    pcVar9 = "true";
    goto LAB_0013a313;
  case 0x4a:
    pcVar9 = "false";
LAB_0013a313:
    string_value.stringval = strdup(pcVar9);
    tag = expr_constant_boolean;
    goto LAB_0013a320;
  case 0x4b:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_logical_and;
    goto LAB_0013a383;
  case 0x4c:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_logical_or;
    goto LAB_0013a383;
  case 0x4d:
    op1 = *pYVar15;
    tag = expr_not;
    goto LAB_0013a2a9;
  case 0x4e:
  case 0x54:
  case 0x55:
  case 0x56:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_greater_equal;
    goto LAB_0013a383;
  case 0x4f:
  case 0x57:
  case 0x58:
  case 0x59:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_less_equal;
    goto LAB_0013a383;
  case 0x50:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x66:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_equal;
    goto LAB_0013a383;
  case 0x51:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_not_equal;
    goto LAB_0013a383;
  case 0x52:
  case 0x60:
  case 0x61:
  case 0x62:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_less;
    goto LAB_0013a383;
  case 0x53:
  case 99:
  case 100:
  case 0x65:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_greater;
    goto LAB_0013a383;
  case 0x67:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_not_equal;
    goto LAB_0013a383;
  case 0x68:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_less;
    goto LAB_0013a383;
  case 0x69:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_greater;
    goto LAB_0013a383;
  case 0x6a:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_greater_equal;
    goto LAB_0013a383;
  case 0x6b:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_less_equal;
    goto LAB_0013a383;
  case 0x6c:
  case 0x7a:
  case 0x8a:
  case 0xa8:
  case 0xc1:
  case 0xd7:
    pcVar9 = *(char **)(pYVar15 + -1);
    break;
  case 0x6d:
    op1 = pYVar15[-1];
    tag = expr_isnan;
    goto LAB_0013a2a9;
  case 0x6e:
    op1 = pYVar15[-1];
    tag = expr_isinf;
    goto LAB_0013a2a9;
  case 0x6f:
    op1 = pYVar15[-1];
    tag = expr_isplusinf;
    goto LAB_0013a2a9;
  case 0x70:
    op1 = pYVar15[-1];
    tag = expr_ismininf;
    goto LAB_0013a2a9;
  case 0x71:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_regex;
    goto LAB_0013a383;
  case 0x72:
    op1 = pYVar15[-1];
    tag = expr_exists;
    goto LAB_0013a2a9;
  case 0x73:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_exists;
    goto LAB_0013a383;
  case 0x74:
    string_value = (YYSTYPE)pYVar15[-3].stringval;
    op1 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_variable_exists;
    goto LAB_0013a322;
  case 0x75:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_all;
    goto LAB_0013a383;
  case 0x76:
  case 0xa0:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_if;
    goto LAB_0013a056;
  case 0x77:
  case 0xa3:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_at;
    goto LAB_0013a383;
  case 0x78:
  case 0xa4:
    string_value = (YYSTYPE)pYVar15[-5].stringval;
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_with;
    goto LAB_0013a385;
  case 0x79:
    string_value = *pYVar15;
    tag = expr_constant_integer;
    goto LAB_0013a320;
  case 0x7b:
  case 0x7c:
  case 0x7d:
    op1 = pYVar15[-1];
    tag = expr_integer;
    goto LAB_0013a2a9;
  case 0x7e:
    string_value = *pYVar15;
    tag = expr_variable_value;
    goto LAB_0013a320;
  case 0x7f:
    string_value = (YYSTYPE)pYVar15[-3].stringval;
    op1 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_variable_value;
    goto LAB_0013a322;
  case 0x80:
    string_value = *pYVar15;
    tag = expr_index_var;
    goto LAB_0013a320;
  case 0x81:
  case 0xac:
    op1 = *pYVar15;
    tag = expr_neg;
    goto LAB_0013a2a9;
  case 0x82:
  case 0xad:
  case 0x105:
  case 0x106:
    pcVar9 = *(char **)pYVar15;
    break;
  case 0x83:
  case 0xae:
  case 0xaf:
  case 0xb0:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_add;
    goto LAB_0013a383;
  case 0x84:
  case 0xb1:
  case 0xb2:
  case 0xb3:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_subtract;
    goto LAB_0013a383;
  case 0x85:
  case 0xb4:
  case 0xb5:
  case 0xb6:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_multiply;
    goto LAB_0013a383;
  case 0x86:
  case 0xb7:
  case 0xb8:
  case 0xb9:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_divide;
    goto LAB_0013a383;
  case 0x87:
  case 0xba:
  case 0xbb:
  case 0xbc:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_modulo;
    goto LAB_0013a383;
  case 0x88:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_and;
    goto LAB_0013a383;
  case 0x89:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_or;
    goto LAB_0013a383;
  case 0x8b:
  case 0xc2:
    op1 = pYVar15[-1];
    tag = expr_abs;
    goto LAB_0013a2a9;
  case 0x8c:
  case 0xc6:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_max;
    goto LAB_0013a383;
  case 0x8d:
  case 199:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_max;
    goto LAB_0013a383;
  case 0x8e:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_min;
    goto LAB_0013a383;
  case 0x8f:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_min;
    goto LAB_0013a383;
  case 0x90:
    op1 = pYVar15[-1];
    tag = expr_num_elements;
    goto LAB_0013a2a9;
  case 0x91:
    op1 = pYVar15[-1];
    tag = expr_num_dims;
    goto LAB_0013a2a9;
  case 0x92:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_dim;
    goto LAB_0013a383;
  case 0x93:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_count;
    goto LAB_0013a383;
  case 0x94:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_add;
    goto LAB_0013a383;
  case 0x95:
  case 0x96:
    op1 = pYVar15[-1];
    tag = expr_length;
    goto LAB_0013a2a9;
  case 0x97:
    op1 = pYVar15[-1];
    tag = expr_bit_size;
    goto LAB_0013a2a9;
  case 0x98:
    op1 = pYVar15[-1];
    tag = expr_byte_size;
    goto LAB_0013a2a9;
  case 0x99:
    tag = expr_product_version;
    goto LAB_0013a15e;
  case 0x9a:
    tag = expr_file_size;
    goto LAB_0013a15e;
  case 0x9b:
    op1 = pYVar15[-1];
    tag = expr_bit_offset;
    goto LAB_0013a2a9;
  case 0x9c:
    op1 = pYVar15[-1];
    tag = expr_byte_offset;
    goto LAB_0013a2a9;
  case 0x9d:
    op1 = pYVar15[-1];
    tag = expr_index;
    goto LAB_0013a2a9;
  case 0x9e:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_index;
    goto LAB_0013a383;
  case 0x9f:
    string_value = (YYSTYPE)pYVar15[-3].stringval;
    op1 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_variable_index;
    goto LAB_0013a322;
  case 0xa1:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_unbound_array_index;
    goto LAB_0013a383;
  case 0xa2:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_unbound_array_index;
    goto LAB_0013a056;
  case 0xa5:
    string_value = *pYVar15;
    tag = expr_constant_float;
    goto LAB_0013a320;
  case 0xa6:
    pcVar9 = "nan";
    goto LAB_0013a036;
  case 0xa7:
    pcVar9 = "inf";
LAB_0013a036:
    string_value.stringval = strdup(pcVar9);
    tag = expr_constant_float;
    goto LAB_0013a320;
  case 0xa9:
  case 0xaa:
  case 0xab:
    op1 = pYVar15[-1];
    tag = expr_float;
    goto LAB_0013a2a9;
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_power;
    goto LAB_0013a383;
  case 0xc3:
    op1 = pYVar15[-1];
    tag = expr_ceil;
    goto LAB_0013a2a9;
  case 0xc4:
    op1 = pYVar15[-1];
    tag = expr_floor;
    goto LAB_0013a2a9;
  case 0xc5:
    op1 = pYVar15[-1];
    tag = expr_round;
    goto LAB_0013a2a9;
  case 200:
  case 0xc9:
  case 0xe4:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_max;
    goto LAB_0013a383;
  case 0xca:
  case 0xe5:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_min;
    goto LAB_0013a383;
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xe6:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_min;
    goto LAB_0013a383;
  case 0xce:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_time;
    goto LAB_0013a383;
  case 0xcf:
  case 0xe7:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_add;
    goto LAB_0013a383;
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xf2:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_if;
    goto LAB_0013a056;
  case 0xd3:
  case 0xf3:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_at;
    goto LAB_0013a383;
  case 0xd5:
    string_value = *pYVar15;
    tag = expr_constant_string;
    goto LAB_0013a320;
  case 0xd6:
    string_value = *pYVar15;
    tag = expr_constant_rawstring;
    goto LAB_0013a320;
  case 0xd8:
  case 0xd9:
    op1 = pYVar15[-1];
    tag = expr_string;
    goto LAB_0013a2a9;
  case 0xda:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_string;
    goto LAB_0013a383;
  case 0xdb:
    op1 = pYVar15[-1];
    tag = expr_bytes;
    goto LAB_0013a2a9;
  case 0xdc:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_bytes;
    goto LAB_0013a383;
  case 0xdd:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_bytes;
    goto LAB_0013a056;
  case 0xde:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    op2 = (YYSTYPE)pYVar15->expr;
    tag = expr_add;
    goto LAB_0013a383;
  case 0xdf:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_substr;
    goto LAB_0013a056;
  case 0xe0:
    op1 = pYVar15[-1];
    tag = expr_ltrim;
    goto LAB_0013a2a9;
  case 0xe1:
    op1 = pYVar15[-1];
    tag = expr_rtrim;
    goto LAB_0013a2a9;
  case 0xe2:
    op1 = pYVar15[-1];
    tag = expr_trim;
    goto LAB_0013a2a9;
  case 0xe3:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_array_max;
    goto LAB_0013a383;
  case 0xe8:
  case 0xe9:
    op1 = (YYSTYPE)pYVar15[-5].expr;
    op2 = (YYSTYPE)pYVar15[-3].expr;
    op3 = pYVar15[-1].expr;
    tag = expr_regex;
LAB_0013a056:
    string_value.stringval = (char *)0x0;
    goto LAB_0013a388;
  case 0xea:
    tag = expr_product_class;
    goto LAB_0013a15e;
  case 0xeb:
    tag = expr_product_format;
    goto LAB_0013a15e;
  case 0xec:
    tag = expr_product_type;
    goto LAB_0013a15e;
  case 0xed:
    tag = expr_filename;
    goto LAB_0013a15e;
  case 0xee:
  case 0xef:
    op1 = pYVar15[-1];
    tag = expr_strtime;
    goto LAB_0013a2a9;
  case 0xf0:
  case 0xf1:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_strtime;
    goto LAB_0013a383;
  case 0xf5:
    tag = expr_goto_root;
    goto LAB_0013a15e;
  case 0xf6:
    tag = expr_goto_here;
    goto LAB_0013a15e;
  case 0xf7:
    tag = expr_goto_begin;
    goto LAB_0013a15e;
  case 0xf8:
    tag = expr_goto_parent;
    goto LAB_0013a15e;
  case 0xf9:
    tag = expr_asciiline;
LAB_0013a15e:
    string_value.stringval = (char *)0x0;
LAB_0013a320:
    op1.stringval = (char *)0x0;
    goto LAB_0013a322;
  case 0xfa:
    op1 = pYVar15[-1];
    goto LAB_00139f73;
  case 0xfb:
    op1 = pYVar15[-3];
    goto LAB_0013a092;
  case 0xfc:
    op1 = pYVar15[-2];
    tag = expr_goto_parent;
LAB_0013a2a9:
    string_value.stringval = (char *)0x0;
LAB_0013a322:
    op2.stringval = (char *)0x0;
    goto LAB_0013a385;
  case 0xfd:
    op1 = pYVar15[-2];
LAB_00139f73:
    string_value = (YYSTYPE)pYVar15->stringval;
    tag = expr_goto_field;
    goto LAB_0013a322;
  case 0xfe:
    op1 = pYVar15[-4];
LAB_0013a092:
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_goto_field;
    goto LAB_0013a383;
  case 0xff:
    op2 = pYVar15[-1];
    tag = expr_goto_array_element;
    goto LAB_0013a07d;
  case 0x100:
    op1 = (YYSTYPE)pYVar15[-3].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_goto_array_element;
    goto LAB_0013a383;
  case 0x101:
    string_value = *pYVar15;
    tag = expr_goto_attribute;
    goto LAB_0013a320;
  case 0x102:
    op2 = pYVar15[-1];
    tag = expr_goto_attribute;
LAB_0013a07d:
    string_value.stringval = (char *)0x0;
LAB_0013a299:
    op1.stringval = (char *)0x0;
    goto LAB_0013a385;
  case 0x103:
    op1 = (YYSTYPE)pYVar15[-2].expr;
    string_value = (YYSTYPE)pYVar15->stringval;
    tag = expr_goto_attribute;
    goto LAB_0013a322;
  case 0x104:
    op1 = (YYSTYPE)pYVar15[-4].expr;
    op2 = (YYSTYPE)pYVar15[-1].expr;
    tag = expr_goto_attribute;
LAB_0013a383:
    string_value.stringval = (char *)0x0;
LAB_0013a385:
    op3 = (coda_expression_struct *)0x0;
LAB_0013a388:
    op4 = (coda_expression *)0x0;
LAB_0013a38b:
    pcVar9 = (char *)coda_expression_new(tag,string_value.stringval,op1.expr,op2.expr,op3,op4);
    if ((coda_expression *)pcVar9 == (coda_expression *)0x0) {
      pYVar15 = pYVar15 + -lVar13;
      psVar7 = psVar7 + -lVar13;
      uVar3 = (uint)*psVar7;
      yyvaluep = (yytype_int16 *)extraout_RDX_02;
      goto LAB_0013a43b;
    }
  }
  psVar7 = psVar7 + -lVar13;
  pYVar15[1 - lVar13] = (YYSTYPE)pcVar9;
  uVar3 = (int)*(short *)("" + (long)""[(int)uVar5] * 2 + 0x50) + (int)*psVar7;
  if ((uVar3 < 0xb5c) && (yycheck[uVar3] == *psVar7)) {
    psVar4 = yytable + uVar3;
  }
  else {
    psVar4 = yydefgoto + (long)""[(int)uVar5] + -0x60;
  }
  pYVar15 = pYVar15 + (1 - lVar13);
  uVar3 = (uint)*psVar4;
  goto LAB_0013a4a1;
LAB_00139858:
  yyvaluep = (yytype_int16 *)(ulong)uVar5;
  yVar12 = YYSYMBOL_YYEMPTY;
  if ((local_8e4 != 0xfffffffe) && (yVar12 = YYSYMBOL_YYUNDEF, local_8e4 < 0x14a)) {
    yVar12 = (yysymbol_kind_t)""[local_8e4];
  }
  scanner_00 = (yytype_int8 *)(ulong)local_8d4;
  if (local_8d4 != 3) {
    if (local_8d4 != 0) goto LAB_0013a43b;
    local_898.yyssp = psVar7;
    local_898.yytoken = yVar12;
    iVar8 = yysyntax_error((long *)&local_8b8,&local_8d0,&local_898);
    if (iVar8 == -1) {
      if (local_8d0 != local_888) {
        free(local_8d0);
      }
      pcVar9 = (char *)malloc(local_8b8);
      if (pcVar9 == (char *)0x0) {
        local_8b8 = 0x80;
        iVar8 = -2;
        pcVar9 = "syntax error";
        local_8d0 = local_888;
      }
      else {
        local_8d0 = pcVar9;
        iVar8 = yysyntax_error((long *)&local_8b8,&local_8d0,&local_898);
      }
    }
    else {
      pcVar9 = "syntax error";
      if (iVar8 == 0) {
        iVar8 = 0;
        pcVar9 = local_8d0;
      }
    }
    coda_set_error(-0x191,"%s",pcVar9);
    yyvaluep = (yytype_int16 *)extraout_RDX_00;
    if (iVar8 != -2) goto LAB_0013a43b;
    goto LAB_0013a5b3;
  }
  if ((int)local_8e4 < 1) {
    if (local_8e4 != 0) goto LAB_0013a43b;
    local_8e4 = 0;
    iVar8 = 1;
LAB_0013a4f7:
    if (local_8e4 != 0xfffffffe) {
      pcVar9 = (char *)0x2;
      if (local_8e4 < 0x14a) {
        scanner_00 = "";
        pcVar9 = (char *)(ulong)(uint)(int)""[local_8e4];
      }
      yydestruct(pcVar9,(yysymbol_kind_t)&local_8c8,(YYSTYPE *)yyvaluep,scanner_00);
      yyvaluep = (yytype_int16 *)extraout_RDX_04;
    }
    for (; psVar7 != local_8e0; psVar7 = psVar7 + -1) {
      yydestruct((char *)(ulong)(uint)(int)""[*psVar7],(yysymbol_kind_t)pYVar15,(YYSTYPE *)yyvaluep,
                 scanner_00);
      pYVar15 = pYVar15 + -1;
      yyvaluep = (yytype_int16 *)extraout_RDX_05;
    }
    if (local_8e0 != local_808) {
      free(local_8e0);
    }
    if (local_8d0 != local_888) {
      free(local_8d0);
    }
    return iVar8;
  }
  yydestruct((char *)(ulong)(uint)yVar12,(yysymbol_kind_t)&local_8c8,(YYSTYPE *)yyvaluep,scanner_00)
  ;
  local_8e4 = 0xfffffffe;
  yyvaluep = (yytype_int16 *)extraout_RDX_01;
LAB_0013a43b:
  pYVar15 = pYVar15 + 1;
  do {
    scanner_00 = (yytype_int8 *)(long)(int)uVar3;
    if (-2 < yypact[(long)scanner_00]) {
      uVar3 = (int)yypact[(long)scanner_00] + 1;
      yyvaluep = yycheck;
      if (yycheck[uVar3] == 1) {
        uVar3 = (uint)yytable[uVar3];
        yyvaluep = (yytype_int16 *)(ulong)uVar3;
        if (0 < (int)uVar3) break;
      }
    }
    pYVar15 = pYVar15 + -1;
    if (psVar7 == __src) {
      iVar8 = 1;
      goto LAB_0013a4f7;
    }
    yydestruct((char *)(ulong)(uint)(int)(char)*(short *)((long)scanner_00 + 0x19c9f0),
               (yysymbol_kind_t)pYVar15,(YYSTYPE *)yyvaluep,scanner_00);
    uVar3 = (uint)psVar7[-1];
    psVar7 = psVar7 + -1;
    yyvaluep = (yytype_int16 *)extraout_RDX_03;
  } while( true );
  *pYVar15 = local_8c8;
  local_8d4 = 3;
LAB_0013a4a1:
  psVar7 = psVar7 + 1;
  yyvaluep = (yytype_int16 *)local_8a8;
  goto LAB_001395d1;
}

Assistant:

int
yyparse (void *scanner)
{
/* Lookahead token kind.  */
int yychar;


/* The semantic value of the lookahead symbol.  */
/* Default value used for initialization, for pacifying older GCCs
   or non-GCC compilers.  */
YY_INITIAL_VALUE (static YYSTYPE yyval_default;)
YYSTYPE yylval YY_INITIAL_VALUE (= yyval_default);

    /* Number of syntax errors so far.  */
    int yynerrs = 0;

    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex (&yylval, scanner);
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* input: boolexpr  */
#line 181 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { parsed_expression = (yyvsp[0].expr); }
#line 2478 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 3: /* input: intexpr  */
#line 182 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
              { parsed_expression = (yyvsp[0].expr); }
#line 2484 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 4: /* input: floatexpr  */
#line 183 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { parsed_expression = (yyvsp[0].expr); }
#line 2490 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 5: /* input: stringexpr  */
#line 184 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { parsed_expression = (yyvsp[0].expr); }
#line 2496 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 6: /* input: voidexpr  */
#line 185 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { parsed_expression = (yyvsp[0].expr); }
#line 2502 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 7: /* input: node  */
#line 186 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
           { parsed_expression = (yyvsp[0].expr); }
#line 2508 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 8: /* reserved_identifier: RAW_PREFIX  */
#line 189 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "r"; }
#line 2514 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 9: /* reserved_identifier: ASCIILINE  */
#line 190 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "asciiline"; }
#line 2520 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 10: /* reserved_identifier: DO  */
#line 191 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
          { (yyval.stringval) = "do"; }
#line 2526 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 11: /* reserved_identifier: FOR  */
#line 192 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
          { (yyval.stringval) = "for"; }
#line 2532 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 12: /* reserved_identifier: STEP  */
#line 193 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
           { (yyval.stringval) = "step"; }
#line 2538 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 13: /* reserved_identifier: TO  */
#line 194 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
         { (yyval.stringval) = "to"; }
#line 2544 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 14: /* reserved_identifier: NAN_VALUE  */
#line 195 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "nan"; }
#line 2550 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 15: /* reserved_identifier: INF_VALUE  */
#line 196 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "inf"; }
#line 2556 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 16: /* reserved_identifier: TRUE_VALUE  */
#line 197 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "true"; }
#line 2562 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 17: /* reserved_identifier: FALSE_VALUE  */
#line 198 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  { (yyval.stringval) = "false"; }
#line 2568 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 18: /* reserved_identifier: FUNC_ABS  */
#line 199 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "abs"; }
#line 2574 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 19: /* reserved_identifier: FUNC_ADD  */
#line 200 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "add"; }
#line 2580 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 20: /* reserved_identifier: FUNC_ALL  */
#line 201 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "all"; }
#line 2586 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 21: /* reserved_identifier: FUNC_AT  */
#line 202 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
              { (yyval.stringval) = "at"; }
#line 2592 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 22: /* reserved_identifier: FUNC_BITOFFSET  */
#line 203 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                     { (yyval.stringval) = "bitoffset"; }
#line 2598 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 23: /* reserved_identifier: FUNC_BOOL  */
#line 204 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "bool"; }
#line 2604 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 24: /* reserved_identifier: FUNC_BYTES  */
#line 205 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "bytes"; }
#line 2610 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 25: /* reserved_identifier: FUNC_BYTEOFFSET  */
#line 206 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                      { (yyval.stringval) = "byteoffset"; }
#line 2616 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 26: /* reserved_identifier: FUNC_BYTESIZE  */
#line 207 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                    { (yyval.stringval) = "bytesize"; }
#line 2622 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 27: /* reserved_identifier: FUNC_CEIL  */
#line 208 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "ceil"; }
#line 2628 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 28: /* reserved_identifier: FUNC_COUNT  */
#line 209 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "count"; }
#line 2634 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 29: /* reserved_identifier: FUNC_DIM  */
#line 210 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "dim"; }
#line 2640 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 30: /* reserved_identifier: FUNC_EXISTS  */
#line 211 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  { (yyval.stringval) = "exists"; }
#line 2646 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 31: /* reserved_identifier: FUNC_FILENAME  */
#line 212 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                    { (yyval.stringval) = "filename"; }
#line 2652 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 32: /* reserved_identifier: FUNC_FILESIZE  */
#line 213 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                    { (yyval.stringval) = "filesize"; }
#line 2658 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 33: /* reserved_identifier: FUNC_FLOAT  */
#line 214 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "float"; }
#line 2664 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 34: /* reserved_identifier: FUNC_FLOOR  */
#line 215 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "floor"; }
#line 2670 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 35: /* reserved_identifier: FUNC_GOTO  */
#line 216 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "goto"; }
#line 2676 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 36: /* reserved_identifier: FUNC_IF  */
#line 217 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
              { (yyval.stringval) = "if"; }
#line 2682 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 37: /* reserved_identifier: FUNC_INDEX  */
#line 218 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "index"; }
#line 2688 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 38: /* reserved_identifier: FUNC_INT  */
#line 219 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "int"; }
#line 2694 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 39: /* reserved_identifier: FUNC_ISNAN  */
#line 220 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "isnan"; }
#line 2700 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 40: /* reserved_identifier: FUNC_ISINF  */
#line 221 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "isinf"; }
#line 2706 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 41: /* reserved_identifier: FUNC_ISPLUSINF  */
#line 222 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                     { (yyval.stringval) = "isplusinf"; }
#line 2712 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 42: /* reserved_identifier: FUNC_ISMININF  */
#line 223 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                    { (yyval.stringval) = "ismininf"; }
#line 2718 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 43: /* reserved_identifier: FUNC_LENGTH  */
#line 224 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  { (yyval.stringval) = "length"; }
#line 2724 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 44: /* reserved_identifier: FUNC_LTRIM  */
#line 225 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "ltrim"; }
#line 2730 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 45: /* reserved_identifier: FUNC_NUMDIMS  */
#line 226 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                   { (yyval.stringval) = "numdims"; }
#line 2736 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 46: /* reserved_identifier: FUNC_NUMELEMENTS  */
#line 227 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                       { (yyval.stringval) = "numelements"; }
#line 2742 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 47: /* reserved_identifier: FUNC_MAX  */
#line 228 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "max"; }
#line 2748 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 48: /* reserved_identifier: FUNC_MIN  */
#line 229 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "min"; }
#line 2754 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 49: /* reserved_identifier: FUNC_PRODUCTCLASS  */
#line 230 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                        { (yyval.stringval) = "productclass"; }
#line 2760 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 50: /* reserved_identifier: FUNC_PRODUCTFORMAT  */
#line 231 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                         { (yyval.stringval) = "productformat"; }
#line 2766 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 51: /* reserved_identifier: FUNC_PRODUCTTYPE  */
#line 232 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                       { (yyval.stringval) = "producttype"; }
#line 2772 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 52: /* reserved_identifier: FUNC_PRODUCTVERSION  */
#line 233 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          { (yyval.stringval) = "productversion"; }
#line 2778 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 53: /* reserved_identifier: FUNC_REGEX  */
#line 234 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "regex"; }
#line 2784 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 54: /* reserved_identifier: FUNC_ROUND  */
#line 235 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "round"; }
#line 2790 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 55: /* reserved_identifier: FUNC_RTRIM  */
#line 236 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                 { (yyval.stringval) = "rtrim"; }
#line 2796 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 56: /* reserved_identifier: FUNC_STR  */
#line 237 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.stringval) = "str"; }
#line 2802 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 57: /* reserved_identifier: FUNC_STRTIME  */
#line 238 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                   { (yyval.stringval) = "strtime"; }
#line 2808 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 58: /* reserved_identifier: FUNC_SUBSTR  */
#line 239 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  { (yyval.stringval) = "substr"; }
#line 2814 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 59: /* reserved_identifier: FUNC_TIME  */
#line 240 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "time"; }
#line 2820 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 60: /* reserved_identifier: FUNC_TRIM  */
#line 241 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "trim"; }
#line 2826 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 61: /* reserved_identifier: FUNC_UNBOUNDINDEX  */
#line 242 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                        { (yyval.stringval) = "unboundindex"; }
#line 2832 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 62: /* reserved_identifier: FUNC_WITH  */
#line 243 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                { (yyval.stringval) = "with"; }
#line 2838 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 65: /* identifier: reserved_identifier  */
#line 249 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          { (yyval.stringval) = strdup((yyvsp[0].stringval)); }
#line 2844 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 66: /* voidexpr: '$' identifier '=' intexpr  */
#line 253 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_variable_set, (yyvsp[-2].stringval), NULL, (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2853 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 67: /* voidexpr: '$' identifier '[' intexpr ']' '=' intexpr  */
#line 257 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                 {
            (yyval.expr) = coda_expression_new(expr_variable_set, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2862 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 68: /* voidexpr: voidexpr ';' voidexpr  */
#line 261 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_sequence, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2871 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 69: /* voidexpr: FOR INDEX_VAR '=' intexpr TO intexpr DO voidexpr  */
#line 265 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                       {
            (yyval.expr) = coda_expression_new(expr_for, (yyvsp[-6].stringval), (yyvsp[-4].expr), (yyvsp[-2].expr), NULL, (yyvsp[0].expr));
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2880 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 70: /* voidexpr: FOR INDEX_VAR '=' intexpr TO intexpr STEP intexpr DO voidexpr  */
#line 269 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                                    {
            (yyval.expr) = coda_expression_new(expr_for, (yyvsp[-8].stringval), (yyvsp[-6].expr), (yyvsp[-4].expr), (yyvsp[-2].expr), (yyvsp[0].expr));
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2889 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 71: /* voidexpr: FUNC_GOTO '(' node ')'  */
#line 273 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                             {
            (yyval.expr) = coda_expression_new(expr_goto, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2898 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 72: /* voidexpr: FUNC_WITH '(' INDEX_VAR '=' intexpr ',' voidexpr ')'  */
#line 277 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                           {
            (yyval.expr) = coda_expression_new(expr_with, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2907 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 73: /* boolexpr: TRUE_VALUE  */
#line 284 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_constant_boolean, strdup("true"), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2916 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 74: /* boolexpr: FALSE_VALUE  */
#line 288 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  {
            (yyval.expr) = coda_expression_new(expr_constant_boolean, strdup("false"), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2925 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 75: /* boolexpr: boolexpr LOGICAL_AND boolexpr  */
#line 292 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_logical_and, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2934 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 76: /* boolexpr: boolexpr LOGICAL_OR boolexpr  */
#line 296 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_logical_or, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2943 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 77: /* boolexpr: NOT boolexpr  */
#line 300 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                   {
            (yyval.expr) = coda_expression_new(expr_not, NULL, (yyvsp[0].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2952 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 78: /* boolexpr: intexpr GREATER_EQUAL intexpr  */
#line 304 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_greater_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2961 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 79: /* boolexpr: intexpr LESS_EQUAL intexpr  */
#line 308 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_less_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2970 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 80: /* boolexpr: intexpr EQUAL intexpr  */
#line 312 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2979 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 81: /* boolexpr: intexpr NOT_EQUAL intexpr  */
#line 316 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_not_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2988 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 82: /* boolexpr: intexpr '<' intexpr  */
#line 320 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_less, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 2997 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 83: /* boolexpr: intexpr '>' intexpr  */
#line 324 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_greater, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3006 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 84: /* boolexpr: floatexpr GREATER_EQUAL floatexpr  */
#line 328 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_greater_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3015 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 85: /* boolexpr: floatexpr GREATER_EQUAL intexpr  */
#line 332 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                      {
            (yyval.expr) = coda_expression_new(expr_greater_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3024 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 86: /* boolexpr: intexpr GREATER_EQUAL floatexpr  */
#line 336 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                      {
            (yyval.expr) = coda_expression_new(expr_greater_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3033 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 87: /* boolexpr: floatexpr LESS_EQUAL floatexpr  */
#line 340 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                     {
            (yyval.expr) = coda_expression_new(expr_less_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3042 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 88: /* boolexpr: floatexpr LESS_EQUAL intexpr  */
#line 344 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_less_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3051 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 89: /* boolexpr: intexpr LESS_EQUAL floatexpr  */
#line 348 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_less_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3060 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 90: /* boolexpr: floatexpr EQUAL floatexpr  */
#line 352 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3069 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 91: /* boolexpr: floatexpr EQUAL intexpr  */
#line 356 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3078 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 92: /* boolexpr: intexpr EQUAL floatexpr  */
#line 360 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3087 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 93: /* boolexpr: floatexpr NOT_EQUAL floatexpr  */
#line 364 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_not_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3096 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 94: /* boolexpr: floatexpr NOT_EQUAL intexpr  */
#line 368 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_not_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3105 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 95: /* boolexpr: intexpr NOT_EQUAL floatexpr  */
#line 372 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_not_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3114 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 96: /* boolexpr: floatexpr '<' floatexpr  */
#line 376 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_less, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3123 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 97: /* boolexpr: floatexpr '<' intexpr  */
#line 380 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_less, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3132 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 98: /* boolexpr: intexpr '<' floatexpr  */
#line 384 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_less, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3141 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 99: /* boolexpr: floatexpr '>' floatexpr  */
#line 388 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_greater, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3150 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 100: /* boolexpr: floatexpr '>' intexpr  */
#line 392 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_greater, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3159 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 101: /* boolexpr: intexpr '>' floatexpr  */
#line 396 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_greater, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3168 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 102: /* boolexpr: stringexpr EQUAL stringexpr  */
#line 400 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3177 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 103: /* boolexpr: stringexpr NOT_EQUAL stringexpr  */
#line 404 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                      {
            (yyval.expr) = coda_expression_new(expr_not_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3186 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 104: /* boolexpr: stringexpr '<' stringexpr  */
#line 408 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_less, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3195 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 105: /* boolexpr: stringexpr '>' stringexpr  */
#line 412 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_greater, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3204 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 106: /* boolexpr: stringexpr GREATER_EQUAL stringexpr  */
#line 416 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_greater_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3213 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 107: /* boolexpr: stringexpr LESS_EQUAL stringexpr  */
#line 420 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                       {
            (yyval.expr) = coda_expression_new(expr_less_equal, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3222 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 108: /* boolexpr: '(' boolexpr ')'  */
#line 424 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                       { (yyval.expr) = (yyvsp[-1].expr); }
#line 3228 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 109: /* boolexpr: FUNC_ISNAN '(' floatexpr ')'  */
#line 425 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_isnan, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3237 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 110: /* boolexpr: FUNC_ISINF '(' floatexpr ')'  */
#line 429 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_isinf, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3246 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 111: /* boolexpr: FUNC_ISPLUSINF '(' floatexpr ')'  */
#line 433 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                       {
            (yyval.expr) = coda_expression_new(expr_isplusinf, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3255 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 112: /* boolexpr: FUNC_ISMININF '(' floatexpr ')'  */
#line 437 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                      {
            (yyval.expr) = coda_expression_new(expr_ismininf, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3264 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 113: /* boolexpr: FUNC_REGEX '(' stringexpr ',' stringexpr ')'  */
#line 441 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                   {
            (yyval.expr) = coda_expression_new(expr_regex, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3273 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 114: /* boolexpr: FUNC_EXISTS '(' node ')'  */
#line 445 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_exists, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3282 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 115: /* boolexpr: FUNC_EXISTS '(' node ',' boolexpr ')'  */
#line 449 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                            {
            (yyval.expr) = coda_expression_new(expr_array_exists, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3291 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 116: /* boolexpr: FUNC_EXISTS '(' '$' identifier ',' boolexpr ')'  */
#line 453 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                      {
            (yyval.expr) = coda_expression_new(expr_variable_exists, (yyvsp[-3].stringval), (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3300 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 117: /* boolexpr: FUNC_ALL '(' node ',' boolexpr ')'  */
#line 457 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                         {
            (yyval.expr) = coda_expression_new(expr_array_all, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3309 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 118: /* boolexpr: FUNC_IF '(' boolexpr ',' boolexpr ',' boolexpr ')'  */
#line 461 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                         {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3318 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 119: /* boolexpr: FUNC_AT '(' node ',' boolexpr ')'  */
#line 465 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_at, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3327 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 120: /* boolexpr: FUNC_WITH '(' INDEX_VAR '=' intexpr ',' boolexpr ')'  */
#line 469 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                           {
            (yyval.expr) = coda_expression_new(expr_with, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3336 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 121: /* intexpr: INT_VALUE  */
#line 476 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_constant_integer, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3345 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 122: /* intexpr: FUNC_INT '(' intexpr ')'  */
#line 480 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = (yyvsp[-1].expr);
        }
#line 3353 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 123: /* intexpr: FUNC_INT '(' node ')'  */
#line 483 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_integer, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3362 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 124: /* intexpr: FUNC_INT '(' boolexpr ')'  */
#line 487 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_integer, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3371 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 125: /* intexpr: FUNC_INT '(' stringexpr ')'  */
#line 491 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_integer, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3380 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 126: /* intexpr: '$' identifier  */
#line 495 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                     {
            (yyval.expr) = coda_expression_new(expr_variable_value, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3389 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 127: /* intexpr: '$' identifier '[' intexpr ']'  */
#line 499 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                     {
            (yyval.expr) = coda_expression_new(expr_variable_value, (yyvsp[-3].stringval), (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3398 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 128: /* intexpr: INDEX_VAR  */
#line 503 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_index_var, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3407 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 129: /* intexpr: '-' intexpr  */
#line 507 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_neg, NULL, (yyvsp[0].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3416 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 130: /* intexpr: '+' intexpr  */
#line 511 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              { (yyval.expr) = (yyvsp[0].expr); }
#line 3422 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 131: /* intexpr: intexpr '+' intexpr  */
#line 512 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_add, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3431 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 132: /* intexpr: intexpr '-' intexpr  */
#line 516 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_subtract, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3440 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 133: /* intexpr: intexpr '*' intexpr  */
#line 520 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_multiply, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3449 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 134: /* intexpr: intexpr '/' intexpr  */
#line 524 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_divide, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3458 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 135: /* intexpr: intexpr '%' intexpr  */
#line 528 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_modulo, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3467 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 136: /* intexpr: intexpr AND intexpr  */
#line 532 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_and, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3476 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 137: /* intexpr: intexpr OR intexpr  */
#line 536 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                         {
            (yyval.expr) = coda_expression_new(expr_or, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3485 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 138: /* intexpr: '(' intexpr ')'  */
#line 540 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                      { (yyval.expr) = (yyvsp[-1].expr); }
#line 3491 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 139: /* intexpr: FUNC_ABS '(' intexpr ')'  */
#line 541 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_abs, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3500 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 140: /* intexpr: FUNC_MAX '(' node ',' intexpr ')'  */
#line 545 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_array_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3509 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 141: /* intexpr: FUNC_MAX '(' intexpr ',' intexpr ')'  */
#line 549 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3518 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 142: /* intexpr: FUNC_MIN '(' node ',' intexpr ')'  */
#line 553 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_array_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3527 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 143: /* intexpr: FUNC_MIN '(' intexpr ',' intexpr ')'  */
#line 557 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3536 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 144: /* intexpr: FUNC_NUMELEMENTS '(' node ')'  */
#line 561 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_num_elements, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3545 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 145: /* intexpr: FUNC_NUMDIMS '(' node ')'  */
#line 565 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_num_dims, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3554 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 146: /* intexpr: FUNC_DIM '(' node ',' intexpr ')'  */
#line 569 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_dim, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3563 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 147: /* intexpr: FUNC_COUNT '(' node ',' boolexpr ')'  */
#line 573 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_array_count, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3572 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 148: /* intexpr: FUNC_ADD '(' node ',' intexpr ')'  */
#line 577 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_array_add, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3581 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 149: /* intexpr: FUNC_LENGTH '(' stringexpr ')'  */
#line 581 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                     {
            (yyval.expr) = coda_expression_new(expr_length, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3590 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 150: /* intexpr: FUNC_LENGTH '(' node ')'  */
#line 585 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_length, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3599 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 151: /* intexpr: FUNC_BITSIZE '(' node ')'  */
#line 589 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_bit_size, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3608 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 152: /* intexpr: FUNC_BYTESIZE '(' node ')'  */
#line 593 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_byte_size, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3617 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 153: /* intexpr: FUNC_PRODUCTVERSION '(' ')'  */
#line 597 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_product_version, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3626 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 154: /* intexpr: FUNC_FILESIZE '(' ')'  */
#line 601 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_file_size, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3635 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 155: /* intexpr: FUNC_BITOFFSET '(' node ')'  */
#line 605 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_bit_offset, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3644 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 156: /* intexpr: FUNC_BYTEOFFSET '(' node ')'  */
#line 609 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_byte_offset, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3653 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 157: /* intexpr: FUNC_INDEX '(' node ')'  */
#line 613 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_index, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3662 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 158: /* intexpr: FUNC_INDEX '(' node ',' boolexpr ')'  */
#line 617 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_array_index, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3671 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 159: /* intexpr: FUNC_INDEX '(' '$' identifier ',' boolexpr ')'  */
#line 621 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                     {
            (yyval.expr) = coda_expression_new(expr_variable_index, (yyvsp[-3].stringval), (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3680 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 160: /* intexpr: FUNC_IF '(' boolexpr ',' intexpr ',' intexpr ')'  */
#line 625 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                       {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3689 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 161: /* intexpr: FUNC_UNBOUNDINDEX '(' node ',' boolexpr ')'  */
#line 629 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                  {
            (yyval.expr) = coda_expression_new(expr_unbound_array_index, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3698 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 162: /* intexpr: FUNC_UNBOUNDINDEX '(' node ',' boolexpr ',' boolexpr ')'  */
#line 633 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                               {
            (yyval.expr) = coda_expression_new(expr_unbound_array_index, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3707 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 163: /* intexpr: FUNC_AT '(' node ',' intexpr ')'  */
#line 637 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                       {
            (yyval.expr) = coda_expression_new(expr_at, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3716 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 164: /* intexpr: FUNC_WITH '(' INDEX_VAR '=' intexpr ',' intexpr ')'  */
#line 641 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                          {
            (yyval.expr) = coda_expression_new(expr_with, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3725 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 165: /* floatexpr: FLOAT_VALUE  */
#line 648 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  {
            (yyval.expr) = coda_expression_new(expr_constant_float, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3734 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 166: /* floatexpr: NAN_VALUE  */
#line 652 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_constant_float, strdup("nan"), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3743 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 167: /* floatexpr: INF_VALUE  */
#line 656 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_constant_float, strdup("inf"), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3752 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 168: /* floatexpr: FUNC_FLOAT '(' floatexpr ')'  */
#line 660 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = (yyvsp[-1].expr);
        }
#line 3760 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 169: /* floatexpr: FUNC_FLOAT '(' node ')'  */
#line 663 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_float, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3769 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 170: /* floatexpr: FUNC_FLOAT '(' intexpr ')'  */
#line 667 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_float, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3778 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 171: /* floatexpr: FUNC_FLOAT '(' stringexpr ')'  */
#line 671 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_float, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3787 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 172: /* floatexpr: '-' floatexpr  */
#line 675 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_neg, NULL, (yyvsp[0].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3796 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 173: /* floatexpr: '+' floatexpr  */
#line 679 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                { (yyval.expr) = (yyvsp[0].expr); }
#line 3802 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 174: /* floatexpr: floatexpr '+' floatexpr  */
#line 680 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_add, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3811 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 175: /* floatexpr: floatexpr '+' intexpr  */
#line 684 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_add, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3820 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 176: /* floatexpr: intexpr '+' floatexpr  */
#line 688 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_add, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3829 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 177: /* floatexpr: floatexpr '-' floatexpr  */
#line 692 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_subtract, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3838 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 178: /* floatexpr: floatexpr '-' intexpr  */
#line 696 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_subtract, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3847 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 179: /* floatexpr: intexpr '-' floatexpr  */
#line 700 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_subtract, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3856 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 180: /* floatexpr: floatexpr '*' floatexpr  */
#line 704 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_multiply, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3865 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 181: /* floatexpr: floatexpr '*' intexpr  */
#line 708 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_multiply, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3874 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 182: /* floatexpr: intexpr '*' floatexpr  */
#line 712 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_multiply, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3883 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 183: /* floatexpr: floatexpr '/' floatexpr  */
#line 716 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_divide, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3892 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 184: /* floatexpr: floatexpr '/' intexpr  */
#line 720 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_divide, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3901 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 185: /* floatexpr: intexpr '/' floatexpr  */
#line 724 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_divide, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3910 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 186: /* floatexpr: floatexpr '%' floatexpr  */
#line 728 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_modulo, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3919 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 187: /* floatexpr: floatexpr '%' intexpr  */
#line 732 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_modulo, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3928 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 188: /* floatexpr: intexpr '%' floatexpr  */
#line 736 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_modulo, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3937 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 189: /* floatexpr: floatexpr '^' floatexpr  */
#line 740 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_power, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3946 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 190: /* floatexpr: floatexpr '^' intexpr  */
#line 744 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_power, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3955 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 191: /* floatexpr: intexpr '^' floatexpr  */
#line 748 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_power, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3964 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 192: /* floatexpr: intexpr '^' intexpr  */
#line 752 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_power, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3973 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 193: /* floatexpr: '(' floatexpr ')'  */
#line 756 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                        { (yyval.expr) = (yyvsp[-1].expr); }
#line 3979 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 194: /* floatexpr: FUNC_ABS '(' floatexpr ')'  */
#line 757 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_abs, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3988 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 195: /* floatexpr: FUNC_CEIL '(' floatexpr ')'  */
#line 761 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_ceil, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 3997 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 196: /* floatexpr: FUNC_FLOOR '(' floatexpr ')'  */
#line 765 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_floor, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4006 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 197: /* floatexpr: FUNC_ROUND '(' floatexpr ')'  */
#line 769 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_round, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4015 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 198: /* floatexpr: FUNC_MAX '(' node ',' floatexpr ')'  */
#line 773 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_array_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4024 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 199: /* floatexpr: FUNC_MAX '(' floatexpr ',' floatexpr ')'  */
#line 777 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                               {
            (yyval.expr) = coda_expression_new(expr_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4033 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 200: /* floatexpr: FUNC_MAX '(' floatexpr ',' intexpr ')'  */
#line 781 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                             {
            (yyval.expr) = coda_expression_new(expr_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4042 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 201: /* floatexpr: FUNC_MAX '(' intexpr ',' floatexpr ')'  */
#line 785 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                             {
            (yyval.expr) = coda_expression_new(expr_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4051 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 202: /* floatexpr: FUNC_MIN '(' node ',' floatexpr ')'  */
#line 789 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_array_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4060 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 203: /* floatexpr: FUNC_MIN '(' floatexpr ',' floatexpr ')'  */
#line 793 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                               {
            (yyval.expr) = coda_expression_new(expr_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4069 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 204: /* floatexpr: FUNC_MIN '(' floatexpr ',' intexpr ')'  */
#line 797 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                             {
            (yyval.expr) = coda_expression_new(expr_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4078 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 205: /* floatexpr: FUNC_MIN '(' intexpr ',' floatexpr ')'  */
#line 801 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                             {
            (yyval.expr) = coda_expression_new(expr_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4087 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 206: /* floatexpr: FUNC_TIME '(' stringexpr ',' stringexpr ')'  */
#line 805 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                  {
            (yyval.expr) = coda_expression_new(expr_time, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4096 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 207: /* floatexpr: FUNC_ADD '(' node ',' floatexpr ')'  */
#line 809 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_array_add, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4105 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 208: /* floatexpr: FUNC_IF '(' boolexpr ',' floatexpr ',' floatexpr ')'  */
#line 813 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                           {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4114 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 209: /* floatexpr: FUNC_IF '(' boolexpr ',' floatexpr ',' intexpr ')'  */
#line 817 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                         {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4123 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 210: /* floatexpr: FUNC_IF '(' boolexpr ',' intexpr ',' floatexpr ')'  */
#line 821 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                         {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4132 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 211: /* floatexpr: FUNC_AT '(' node ',' floatexpr ')'  */
#line 825 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                         {
            (yyval.expr) = coda_expression_new(expr_at, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4141 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 212: /* floatexpr: FUNC_WITH '(' INDEX_VAR '=' intexpr ',' floatexpr ')'  */
#line 829 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                            {
            (yyval.expr) = coda_expression_new(expr_with, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4150 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 213: /* stringexpr: STRING_VALUE  */
#line 836 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                   {
            (yyval.expr) = coda_expression_new(expr_constant_string, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4159 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 214: /* stringexpr: RAW_PREFIX STRING_VALUE  */
#line 840 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_constant_rawstring, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4168 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 215: /* stringexpr: FUNC_STR '(' stringexpr ')'  */
#line 844 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = (yyvsp[-1].expr);
        }
#line 4176 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 216: /* stringexpr: FUNC_STR '(' intexpr ')'  */
#line 847 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_string, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4185 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 217: /* stringexpr: FUNC_STR '(' node ')'  */
#line 851 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_string, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4194 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 218: /* stringexpr: FUNC_STR '(' node ',' intexpr ')'  */
#line 855 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                        {
            (yyval.expr) = coda_expression_new(expr_string, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4203 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 219: /* stringexpr: FUNC_BYTES '(' node ')'  */
#line 859 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                              {
            (yyval.expr) = coda_expression_new(expr_bytes, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4212 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 220: /* stringexpr: FUNC_BYTES '(' node ',' intexpr ')'  */
#line 863 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_bytes, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4221 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 221: /* stringexpr: FUNC_BYTES '(' node ',' intexpr ',' intexpr ')'  */
#line 867 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                      {
            (yyval.expr) = coda_expression_new(expr_bytes, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4230 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 222: /* stringexpr: stringexpr '+' stringexpr  */
#line 871 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_add, NULL, (yyvsp[-2].expr), (yyvsp[0].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4239 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 223: /* stringexpr: FUNC_SUBSTR '(' intexpr ',' intexpr ',' stringexpr ')'  */
#line 875 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                             {
            (yyval.expr) = coda_expression_new(expr_substr, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4248 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 224: /* stringexpr: FUNC_LTRIM '(' stringexpr ')'  */
#line 879 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_ltrim, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4257 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 225: /* stringexpr: FUNC_RTRIM '(' stringexpr ')'  */
#line 883 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                    {
            (yyval.expr) = coda_expression_new(expr_rtrim, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4266 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 226: /* stringexpr: FUNC_TRIM '(' stringexpr ')'  */
#line 887 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_trim, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4275 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 227: /* stringexpr: FUNC_MAX '(' node ',' stringexpr ')'  */
#line 891 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_array_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4284 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 228: /* stringexpr: FUNC_MAX '(' stringexpr ',' stringexpr ')'  */
#line 895 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                 {
            (yyval.expr) = coda_expression_new(expr_max, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4293 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 229: /* stringexpr: FUNC_MIN '(' node ',' stringexpr ')'  */
#line 899 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_array_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4302 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 230: /* stringexpr: FUNC_MIN '(' stringexpr ',' stringexpr ')'  */
#line 903 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                 {
            (yyval.expr) = coda_expression_new(expr_min, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4311 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 231: /* stringexpr: FUNC_ADD '(' node ',' stringexpr ')'  */
#line 907 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                           {
            (yyval.expr) = coda_expression_new(expr_array_add, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4320 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 232: /* stringexpr: FUNC_REGEX '(' stringexpr ',' stringexpr ',' intexpr ')'  */
#line 911 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                               {
            (yyval.expr) = coda_expression_new(expr_regex, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4329 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 233: /* stringexpr: FUNC_REGEX '(' stringexpr ',' stringexpr ',' stringexpr ')'  */
#line 915 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                                  {
            (yyval.expr) = coda_expression_new(expr_regex, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4338 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 234: /* stringexpr: FUNC_PRODUCTCLASS '(' ')'  */
#line 919 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                {
            (yyval.expr) = coda_expression_new(expr_product_class, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4347 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 235: /* stringexpr: FUNC_PRODUCTFORMAT '(' ')'  */
#line 923 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_product_format, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4356 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 236: /* stringexpr: FUNC_PRODUCTTYPE '(' ')'  */
#line 927 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_product_type, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4365 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 237: /* stringexpr: FUNC_FILENAME '(' ')'  */
#line 931 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                            {
            (yyval.expr) = coda_expression_new(expr_filename, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4374 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 238: /* stringexpr: FUNC_STRTIME '(' intexpr ')'  */
#line 935 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                   {
            (yyval.expr) = coda_expression_new(expr_strtime, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4383 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 239: /* stringexpr: FUNC_STRTIME '(' floatexpr ')'  */
#line 939 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                     {
            (yyval.expr) = coda_expression_new(expr_strtime, NULL, (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4392 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 240: /* stringexpr: FUNC_STRTIME '(' intexpr ',' stringexpr ')'  */
#line 943 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                  {
            (yyval.expr) = coda_expression_new(expr_strtime, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4401 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 241: /* stringexpr: FUNC_STRTIME '(' floatexpr ',' stringexpr ')'  */
#line 947 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                    {
            (yyval.expr) = coda_expression_new(expr_strtime, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4410 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 242: /* stringexpr: FUNC_IF '(' boolexpr ',' stringexpr ',' stringexpr ')'  */
#line 951 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                             {
            (yyval.expr) = coda_expression_new(expr_if, NULL, (yyvsp[-5].expr), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4419 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 243: /* stringexpr: FUNC_AT '(' node ',' stringexpr ')'  */
#line 955 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                          {
            (yyval.expr) = coda_expression_new(expr_at, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4428 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 244: /* stringexpr: FUNC_WITH '(' INDEX_VAR '=' intexpr ',' stringexpr ')'  */
#line 959 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                                             {
            (yyval.expr) = coda_expression_new(expr_with, (yyvsp[-5].stringval), (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4437 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 245: /* rootnode: '/'  */
#line 966 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
          {
            (yyval.expr) = coda_expression_new(expr_goto_root, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4446 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 246: /* nonrootnode: '.'  */
#line 973 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
          {
            (yyval.expr) = coda_expression_new(expr_goto_here, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4455 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 247: /* nonrootnode: ':'  */
#line 977 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
          {
            (yyval.expr) = coda_expression_new(expr_goto_begin, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4464 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 248: /* nonrootnode: GOTO_PARENT  */
#line 981 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  {
            (yyval.expr) = coda_expression_new(expr_goto_parent, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4473 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 249: /* nonrootnode: ASCIILINE  */
#line 985 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                {
            (yyval.expr) = coda_expression_new(expr_asciiline, NULL, NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4482 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 250: /* nonrootnode: rootnode identifier  */
#line 989 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_goto_field, (yyvsp[0].stringval), (yyvsp[-1].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4491 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 251: /* nonrootnode: rootnode '{' intexpr '}'  */
#line 993 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_goto_field, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4500 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 252: /* nonrootnode: nonrootnode '/' GOTO_PARENT  */
#line 997 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                  {
            (yyval.expr) = coda_expression_new(expr_goto_parent, NULL, (yyvsp[-2].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4509 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 253: /* nonrootnode: nonrootnode '/' identifier  */
#line 1001 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                 {
            (yyval.expr) = coda_expression_new(expr_goto_field, (yyvsp[0].stringval), (yyvsp[-2].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4518 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 254: /* nonrootnode: nonrootnode '/' '{' intexpr '}'  */
#line 1005 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                                      {
            (yyval.expr) = coda_expression_new(expr_goto_field, NULL, (yyvsp[-4].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4527 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 255: /* nonrootnode: '[' intexpr ']'  */
#line 1009 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                      {
            (yyval.expr) = coda_expression_new(expr_goto_array_element, NULL, NULL, (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4536 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 256: /* nonrootnode: node '[' intexpr ']'  */
#line 1013 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                           {
            (yyval.expr) = coda_expression_new(expr_goto_array_element, NULL, (yyvsp[-3].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4545 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 257: /* nonrootnode: '@' identifier  */
#line 1017 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                     {
            (yyval.expr) = coda_expression_new(expr_goto_attribute, (yyvsp[0].stringval), NULL, NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4554 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 258: /* nonrootnode: '@' '{' intexpr '}'  */
#line 1021 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_goto_attribute, NULL, NULL, (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4563 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 259: /* nonrootnode: node '@' identifier  */
#line 1025 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                          {
            (yyval.expr) = coda_expression_new(expr_goto_attribute, (yyvsp[0].stringval), (yyvsp[-2].expr), NULL, NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4572 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 260: /* nonrootnode: node '@' '{' intexpr '}'  */
#line 1029 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                               {
            (yyval.expr) = coda_expression_new(expr_goto_attribute, NULL, (yyvsp[-4].expr), (yyvsp[-1].expr), NULL, NULL);
            if ((yyval.expr) == NULL) YYERROR;
        }
#line 4581 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 261: /* node: rootnode  */
#line 1036 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
               { (yyval.expr) = (yyvsp[0].expr); }
#line 4587 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;

  case 262: /* node: nonrootnode  */
#line 1037 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr-parser.y"
                  { (yyval.expr) = (yyvsp[0].expr); }
#line 4593 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"
    break;


#line 4597 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/build_O1/libcoda/coda-expr-parser.c"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yytoken};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (scanner, yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, scanner);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, scanner);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (scanner, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, scanner);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, scanner);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}